

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNPObj.cpp
# Opt level: O0

void __thiscall
NaNNPredictObjectUnit::NaNNPredictObjectUnit
          (NaNNPredictObjectUnit *this,uint nControlDim,uint nOutputDim)

{
  undefined4 *puVar1;
  void *pvVar2;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  undefined8 in_stack_ffffffffffffffd0;
  NaUnit *in_stack_ffffffffffffffe0;
  
  NaUnit::NaUnit(in_stack_ffffffffffffffe0,(uint)((ulong)in_RDI >> 0x20),(uint)in_RDI,
                 (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  *in_RDI = &PTR_PrintLog_00194950;
  *(int *)(in_RDI + 5) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x2c) = in_EDX;
  if (in_ESI == 0) {
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 3;
    __cxa_throw(puVar1,&NaException::typeinfo,0);
  }
  pvVar2 = operator_new__((ulong)(uint)(*(int *)(in_RDI + 5) + *(int *)((long)in_RDI + 0x2c)) << 3);
  in_RDI[6] = pvVar2;
  return;
}

Assistant:

NaNNPredictObjectUnit::NaNNPredictObjectUnit (unsigned nControlDim,
                                              unsigned nOutputDim)
:   nControlDepth(nControlDim),
    nObjectDepth(nOutputDim),
    NaUnit(1/* inputs */, 1/* outputs */, 0/* feedback */)
{
    if(nControlDim < 1)
        // Must be > 0
        throw(na_bad_value);
    pTotalInput = new NaReal[nControlDepth + nObjectDepth];
}